

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O0

void __thiscall
despot::util::tinyxml::TiXmlDeclaration::TiXmlDeclaration
          (TiXmlDeclaration *this,TiXmlDeclaration *copy)

{
  TiXmlDeclaration *copy_local;
  TiXmlDeclaration *this_local;
  
  TiXmlNode::TiXmlNode(&this->super_TiXmlNode,DECLARATION);
  (this->super_TiXmlNode).super_TiXmlBase._vptr_TiXmlBase =
       (_func_int **)&PTR__TiXmlDeclaration_0026f5d0;
  TiXmlString::TiXmlString(&this->version);
  TiXmlString::TiXmlString(&this->encoding);
  TiXmlString::TiXmlString(&this->standalone);
  CopyTo(copy,this);
  return;
}

Assistant:

TiXmlDeclaration::TiXmlDeclaration(const TiXmlDeclaration& copy) :
	TiXmlNode(TiXmlNode::DECLARATION) {
	copy.CopyTo(this);
}